

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
embree::XMLLoader::loadFloatArray
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,XMLLoader *this,
          Ref<embree::XML> *xml)

{
  XML *this_00;
  int iVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ofs","");
    XML::parm(&local_50,this_00,&local_70);
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (iVar1 == 0) {
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::resize
                (__return_storage_ptr__,
                 ((long)(xml->ptr->body).
                        super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(xml->ptr->body).
                        super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      if ((__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        lVar3 = 0;
        uVar2 = 0;
        do {
          fVar4 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->ty +
                                        lVar3),true);
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar2] = fVar4;
          uVar2 = uVar2 + 1;
          lVar3 = lVar3 + 0x48;
        } while (uVar2 < (ulong)((long)(__return_storage_ptr__->
                                       super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(__return_storage_ptr__->
                                       super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                       super__Vector_impl_data._M_start >> 2));
      }
    }
    else {
      loadBinary<std::vector<float,std::allocator<float>>>(__return_storage_ptr__,this,xml);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> XMLLoader::loadFloatArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<float>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<float>>(xml);
    } 
    else 
    {
      std::vector<float> data;
      data.resize(xml->body.size());
      for (size_t i=0; i<data.size(); i++) 
        data[i] = xml->body[i].Float();
      return data;
    }
  }